

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void parserDoubleLinkSelect(Parse *pParse,Select *p)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  Select *pSVar4;
  Select *pSVar5;
  
  if (p->pPrior != (Select *)0x0) {
    iVar3 = 0;
    pSVar4 = (Select *)0x0;
    for (pSVar5 = p; pSVar5 != (Select *)0x0; pSVar5 = pSVar5->pPrior) {
      pSVar5->pNext = pSVar4;
      pbVar1 = (byte *)((long)&pSVar5->selFlags + 1);
      *pbVar1 = *pbVar1 | 1;
      iVar3 = iVar3 + 1;
      pSVar4 = pSVar5;
    }
    if ((p->selFlags & 0x400) == 0) {
      iVar2 = pParse->db->aLimit[4];
      if (iVar2 < iVar3 && 0 < iVar2) {
        sqlite3ErrorMsg(pParse,"too many terms in compound SELECT");
        return;
      }
    }
  }
  return;
}

Assistant:

static void parserDoubleLinkSelect(Parse *pParse, Select *p){
    if( p->pPrior ){
      Select *pNext = 0, *pLoop;
      int mxSelect, cnt = 0;
      for(pLoop=p; pLoop; pNext=pLoop, pLoop=pLoop->pPrior, cnt++){
        pLoop->pNext = pNext;
        pLoop->selFlags |= SF_Compound;
      }
      if( (p->selFlags & SF_MultiValue)==0 && 
        (mxSelect = pParse->db->aLimit[SQLITE_LIMIT_COMPOUND_SELECT])>0 &&
        cnt>mxSelect
      ){
        sqlite3ErrorMsg(pParse, "too many terms in compound SELECT");
      }
    }
  }